

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-pound.c
# Opt level: O3

int run_benchmark_tcp4_pound_1000(void)

{
  void *in_R9;
  
  pound_it(1000,"tcp",tcp_do_setup,tcp_do_connect,tcp_make_connect,in_R9);
  return 0;
}

Assistant:

BENCHMARK_IMPL(tcp4_pound_1000) {
  return pound_it(1000,
                  "tcp",
                  tcp_do_setup,
                  tcp_do_connect,
                  tcp_make_connect,
                  NULL);
}